

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O0

char * doh_type2name(DNStype dnstype)

{
  char *pcStack_10;
  DNStype dnstype_local;
  
  if (dnstype == DNS_TYPE_A) {
    pcStack_10 = "A";
  }
  else if (dnstype == DNS_TYPE_AAAA) {
    pcStack_10 = "AAAA";
  }
  else {
    pcStack_10 = "unknown";
  }
  return pcStack_10;
}

Assistant:

static const char *doh_type2name(DNStype dnstype)
{
  switch(dnstype) {
    case DNS_TYPE_A:
      return "A";
    case DNS_TYPE_AAAA:
      return "AAAA";
#ifdef USE_HTTPSRR
    case DNS_TYPE_HTTPS:
      return "HTTPS";
#endif
    default:
       return "unknown";
  }
}